

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

void __thiscall UnifiedRegex::Program::FreeBody(Program *this,ArenaAllocator *rtAllocator)

{
  code *pcVar1;
  bool bVar2;
  undefined1 *puVar3;
  BeginLoopIfCharInst *actualInst;
  undefined1 *puVar4;
  undefined4 *local_38;
  
  if ((this->tag == InstructionsTag) &&
     (puVar4 = *(undefined1 **)&this->rep, puVar4 != (undefined1 *)0x0)) {
    puVar3 = puVar4 + (this->rep).insts.instsLen;
    if (puVar4 < puVar3) {
      local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *local_38 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x1655,"(inst < instEnd)","inst < instEnd");
      if (!bVar2) goto LAB_00d41f8a;
      *local_38 = 0;
    }
    do {
      switch(*puVar4) {
      case 0:
      case 1:
      case 2:
      case 0x12:
      case 0x13:
      case 0x14:
      case 0x15:
      case 0x16:
      case 0x17:
      case 0x18:
      case 0x19:
      case 99:
        puVar4 = puVar4 + 1;
        break;
      case 3:
      case 0x1b:
      case 0x26:
      case 0x29:
      case 0x2f:
      case 0x32:
      case 0x40:
      case 0x41:
      case 0x45:
      case 0x48:
      case 0x49:
      case 0x4b:
      case 0x4f:
      case 0x51:
      case 0x5d:
        puVar4 = puVar4 + 5;
        break;
      case 4:
      case 5:
      case 0x1c:
      case 0x5e:
      case 0x5f:
        puVar4 = puVar4 + 7;
        break;
      case 6:
      case 7:
      case 0x60:
      case 0x61:
        RuntimeCharSet<char16_t>::FreeBody((RuntimeCharSet<char16_t> *)(puVar4 + 1),rtAllocator);
        puVar4 = puVar4 + 0x2d;
        break;
      case 8:
      case 0xd:
      case 0x62:
        puVar4 = puVar4 + 0xe;
        break;
      case 9:
      case 0xe:
        puVar4 = puVar4 + 0x1a;
        break;
      case 10:
      case 0xf:
        puVar4 = puVar4 + 0x32;
        break;
      case 0xb:
      case 0x10:
        puVar4 = puVar4 + 0x62;
        break;
      case 0xc:
      case 0x11:
        puVar4 = puVar4 + 0x92;
        break;
      case 0x1a:
      case 0x23:
      case 0x25:
      case 0x2e:
      case 0x52:
      case 0x53:
        puVar4 = puVar4 + 3;
        break;
      case 0x1d:
      case 0x20:
      case 0x21:
      case 0x50:
        puVar4 = puVar4 + 9;
        break;
      case 0x1e:
      case 0x1f:
      case 0x24:
      case 0x27:
      case 0x28:
      case 0x30:
      case 0x31:
      case 0x54:
      case 0x55:
        RuntimeCharSet<char16_t>::FreeBody((RuntimeCharSet<char16_t> *)(puVar4 + 1),rtAllocator);
        puVar4 = puVar4 + 0x29;
        break;
      case 0x22:
        RuntimeCharTrie::FreeBody((RuntimeCharTrie *)(puVar4 + 1),rtAllocator);
        puVar4 = puVar4 + 0x11;
        break;
      case 0x2a:
      case 0x2c:
      case 0x2d:
      case 0x33:
      case 0x35:
      case 0x36:
        ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>::FreeBody
                  ((ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_> *)(puVar4 + 1),
                   rtAllocator);
        puVar4 = puVar4 + 0x449;
        break;
      case 0x2b:
      case 0x34:
        ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>::FreeBody
                  ((ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_> *)
                   (puVar4 + 1),rtAllocator);
        puVar4 = puVar4 + 0x39;
        break;
      case 0x37:
      case 0x5a:
        puVar4 = puVar4 + 0xb;
        break;
      case 0x38:
      case 0x39:
      case 0x5b:
        RuntimeCharSet<char16_t>::FreeBody((RuntimeCharSet<char16_t> *)(puVar4 + 1),rtAllocator);
        puVar4 = puVar4 + 0x31;
        break;
      case 0x3a:
        puVar4 = puVar4 + 0xd;
        break;
      case 0x3b:
      case 0x3d:
      case 0x3e:
        ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>::FreeBody
                  ((ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_> *)(puVar4 + 1),
                   rtAllocator);
        puVar4 = puVar4 + 0x451;
        break;
      case 0x3c:
        ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>::FreeBody
                  ((ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_> *)
                   (puVar4 + 1),rtAllocator);
        puVar4 = puVar4 + 0x41;
        break;
      case 0x3f:
        ScannersMixin::FreeBody((ScannersMixin *)(puVar4 + 1),rtAllocator);
        puVar4 = puVar4 + 0x15;
        break;
      case 0x42:
        puVar4 = puVar4 + 6;
        break;
      case 0x43:
        puVar4 = puVar4 + 10;
        break;
      case 0x44:
      case 0x4e:
        puVar4 = puVar4 + 0x1c;
        break;
      case 0x46:
        puVar4 = puVar4 + 0x1d;
        break;
      case 0x47:
        RuntimeCharSet<char16_t>::FreeBody((RuntimeCharSet<char16_t> *)(puVar4 + 1),rtAllocator);
        puVar4 = puVar4 + 0x43;
        break;
      case 0x4a:
        puVar4 = puVar4 + 0x17;
        break;
      case 0x4c:
      case 0x5c:
        RuntimeCharSet<char16_t>::FreeBody((RuntimeCharSet<char16_t> *)(puVar4 + 1),rtAllocator);
        puVar4 = puVar4 + 0x36;
        break;
      case 0x4d:
        RuntimeCharSet<char16_t>::FreeBody((RuntimeCharSet<char16_t> *)(puVar4 + 1),rtAllocator);
        puVar4 = puVar4 + 0x38;
        break;
      case 0x56:
      case 0x57:
        puVar4 = puVar4 + 8;
        break;
      case 0x58:
      case 0x59:
        RuntimeCharSet<char16_t>::FreeBody((RuntimeCharSet<char16_t> *)(puVar4 + 1),rtAllocator);
        puVar4 = puVar4 + 0x2e;
        break;
      default:
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_38 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                           ,0x1669,"(false)","false");
        if (!bVar2) goto LAB_00d41f8a;
        *local_38 = 0;
      }
    } while (puVar4 < puVar3);
    if (puVar4 != puVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_38 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x166d,"(inst == instEnd)","inst == instEnd");
      if (!bVar2) {
LAB_00d41f8a:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *local_38 = 0;
    }
    (this->rep).insts.insts.ptr = (uchar *)0x0;
    (this->rep).insts.instsLen = 0;
  }
  return;
}

Assistant:

void Program::FreeBody(ArenaAllocator* rtAllocator)
    {
        if (tag != ProgramTag::InstructionsTag || !rep.insts.insts)
        {
            return;
        }

        Inst *inst = reinterpret_cast<Inst *>(PointerValue(rep.insts.insts));
        const auto instEnd = reinterpret_cast<Inst *>(reinterpret_cast<uint8 *>(inst) + rep.insts.instsLen);
        Assert(inst < instEnd);
        do
        {
            switch(inst->tag)
            {
#define MBase(TagName, ClassName) \
                case Inst::InstTag::TagName: \
                { \
                    const auto actualInst = static_cast<ClassName *>(inst); \
                    actualInst->FreeBody(rtAllocator); \
                    inst = actualInst + 1; \
                    break; \
                }
#define M(TagName) MBase(TagName, TagName##Inst)
#define MTemplate(TagName, TemplateDeclaration, GenericClassName, SpecializedClassName) MBase(TagName, SpecializedClassName)
#include "RegexOpCodes.h"
#undef MBase
#undef M
#undef MTemplate
                default:
                    Assert(false);
                    __assume(false);
            }
        } while(inst < instEnd);
        Assert(inst == instEnd);

#if DBG
        rep.insts.insts = nullptr;
        rep.insts.instsLen = 0;
#endif
    }